

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

optional<char> __thiscall Tokenizer::next(Tokenizer *this)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char local_19;
  Tokenizer *pTStack_18;
  char c;
  Tokenizer *this_local;
  
  iVar1 = this->pos;
  pTStack_18 = this;
  uVar2 = std::__cxx11::string::size();
  if ((ulong)(long)iVar1 < uVar2) {
    this->col_number = this->col_number + 1;
    this->pos = this->pos + 1;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&this->program);
    local_19 = *pcVar3;
    std::__cxx11::string::operator+=((string *)&this->current_line,local_19);
    if (local_19 == '\n') {
      this->col_number = 0;
      this->line_number = this->line_number + 1;
      std::__cxx11::string::operator=((string *)&this->current_line,"");
    }
    std::optional<char>::optional<char,_true>((optional<char> *)((long)&this_local + 6),&local_19);
  }
  else {
    std::optional<char>::optional((optional<char> *)((long)&this_local + 6));
  }
  return (_Optional_base<char,_true,_true>)(_Optional_base<char,_true,_true>)this_local._6_2_;
}

Assistant:

optional<char> Tokenizer::next() {
    if (pos >= program.size())
        return {};
    col_number++;
    char c = program[pos++];
    current_line += c;

    if (c == '\n') {
        col_number = 0;
        line_number++;
        current_line = "";
    }
    return c;
}